

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

int deqp::gles31::Functional::computeTotalScalarSize
              (vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               *symbols)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_28;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_20;
  const_iterator sym;
  int totalSize;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols_local;
  
  sym._M_current._4_4_ = 0;
  local_20._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(symbols);
  while( true ) {
    local_28._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(symbols);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_20);
    iVar2 = glu::VarType::getScalarSize(&pSVar3->varType);
    sym._M_current._4_4_ = iVar2 + sym._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_20);
  }
  return sym._M_current._4_4_;
}

Assistant:

static int computeTotalScalarSize (const vector<Symbol>& symbols)
{
	int totalSize = 0;
	for (vector<Symbol>::const_iterator sym = symbols.begin(); sym != symbols.end(); ++sym)
		totalSize += sym->varType.getScalarSize();
	return totalSize;
}